

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type_writers.h
# Opt level: O1

ssize_t __thiscall cppwinrt::writer::write(writer *this,int __fd,void *__buf,size_t __n)

{
  database *pdVar1;
  ConstantType CVar2;
  ssize_t extraout_RAX;
  ssize_t extraout_RAX_00;
  ssize_t sVar3;
  invalid_argument *this_00;
  undefined4 in_register_00000034;
  undefined8 *puVar4;
  uint local_28;
  undefined4 uStack_24;
  
  puVar4 = (undefined8 *)CONCAT44(in_register_00000034,__fd);
  CVar2 = winmd::reader::table_base::get_value<winmd::reader::ConstantType>
                    ((table_base *)*puVar4,*(uint32_t *)(puVar4 + 1),0);
  if (CVar2 == UInt32) {
    pdVar1 = ((table_base *)*puVar4)->m_database;
    winmd::reader::table_base::get_value<unsigned_int>
              ((table_base *)*puVar4,*(uint32_t *)(puVar4 + 1),2);
    winmd::reader::database::get_blob((database *)&stack0xffffffffffffffd8,(uint32_t)pdVar1);
    winmd::reader::byte_view::check_available((byte_view *)&stack0xffffffffffffffd8,4);
    local_28 = *(uint *)CONCAT44(uStack_24,local_28);
    writer_base<cppwinrt::writer>::write_printf<unsigned_int>
              (&this->super_writer_base<cppwinrt::writer>,"%#0x",&stack0xffffffffffffffd8);
    sVar3 = extraout_RAX_00;
  }
  else {
    if (CVar2 != Int32) {
      this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::invalid_argument::invalid_argument(this_00,"Unexpected constant type");
      __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument)
      ;
    }
    pdVar1 = ((table_base *)*puVar4)->m_database;
    winmd::reader::table_base::get_value<unsigned_int>
              ((table_base *)*puVar4,*(uint32_t *)(puVar4 + 1),2);
    winmd::reader::database::get_blob((database *)&stack0xffffffffffffffd8,(uint32_t)pdVar1);
    winmd::reader::byte_view::check_available((byte_view *)&stack0xffffffffffffffd8,4);
    local_28 = *(uint *)CONCAT44(uStack_24,local_28);
    writer_base<cppwinrt::writer>::write_printf<int>
              (&this->super_writer_base<cppwinrt::writer>,"%d",(int *)&stack0xffffffffffffffd8);
    sVar3 = extraout_RAX;
  }
  return sVar3;
}

Assistant:

void write(Constant const& value)
        {
            switch (value.Type())
            {
            case ConstantType::Int32:
                write_value(value.ValueInt32());
                break;
            case ConstantType::UInt32:
                write_value(value.ValueUInt32());
                break;
            default:
                throw std::invalid_argument("Unexpected constant type");
            }
        }